

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move3.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  undefined1 local_30 [8];
  Moveable a;
  char **argv_local;
  int argc_local;
  
  a.h._8_8_ = argv;
  getTemp();
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::hex);
  poVar1 = std::operator<<(poVar1,"Huge Mem from ");
  poVar1 = std::operator<<(poVar1,"main");
  poVar1 = std::operator<<(poVar1," @");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,a.i);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Moveable::~Moveable((Moveable *)local_30);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	Moveable a(getTemp());
	std::cout << std::hex << "Huge Mem from " << __func__
			  << " @" << a.h.c << std::endl;
	return 0;
}